

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  byte bVar1;
  u8 uVar2;
  uint uVar3;
  u32 uVar4;
  int iVar5;
  u32 uVar6;
  u8 *puVar7;
  u8 *puVar8;
  bool bVar9;
  bool bVar10;
  uint local_7c;
  uint local_74;
  uint local_6c;
  uint local_68;
  int invert;
  int seen;
  u32 prior_c;
  int bMatch_2;
  int bMatch_1;
  u32 cx;
  int bMatch;
  u8 *zEscaped;
  u8 noCase;
  u32 matchAll;
  u32 matchOne;
  u32 c2;
  u32 c;
  u32 matchOther_local;
  compareInfo *pInfo_local;
  u8 *zString_local;
  u8 *zPattern_local;
  
  uVar3 = (uint)pInfo->matchOne;
  bVar1 = pInfo->matchAll;
  uVar2 = pInfo->noCase;
  _cx = (u8 *)0x0;
  pInfo_local = (compareInfo *)zString;
  zString_local = zPattern;
  do {
    while( true ) {
      if (*zString_local < 0x80) {
        local_68 = (uint)*zString_local;
        zString_local = zString_local + 1;
      }
      else {
        local_68 = sqlite3Utf8Read(&zString_local);
      }
      matchOne = local_68;
      if (local_68 == 0) {
        return (uint)(pInfo_local->matchAll != '\0');
      }
      if (local_68 == bVar1) {
        while( true ) {
          if (*zString_local < 0x80) {
            local_6c = (uint)*zString_local;
            zString_local = zString_local + 1;
          }
          else {
            local_6c = sqlite3Utf8Read(&zString_local);
          }
          matchOne = local_6c;
          if (local_6c != bVar1 && local_6c != uVar3) break;
          if ((local_6c == uVar3) && (uVar4 = sqlite3Utf8Read((uchar **)&pInfo_local), uVar4 == 0))
          {
            return 2;
          }
        }
        if (local_6c == 0) {
          return 0;
        }
        if (local_6c == matchOther) {
          if (pInfo->matchSet != '\0') {
            while( true ) {
              if (pInfo_local->matchAll == '\0') {
                return 2;
              }
              iVar5 = patternCompare(zString_local + -1,&pInfo_local->matchAll,pInfo,matchOther);
              if (iVar5 != 1) break;
              puVar7 = &pInfo_local->matchOne;
              puVar8 = &pInfo_local->matchAll;
              pInfo_local = (compareInfo *)puVar7;
              if (0xbf < *puVar8) {
                for (; (pInfo_local->matchAll & 0xc0) == 0x80;
                    pInfo_local = (compareInfo *)&pInfo_local->matchOne) {
                }
              }
            }
            return iVar5;
          }
          matchOne = sqlite3Utf8Read(&zString_local);
          if (matchOne == 0) {
            return 2;
          }
        }
        if (matchOne < 0x81) {
          if (uVar2 == '\0') {
            bMatch_2 = matchOne;
          }
          else {
            bMatch_2 = matchOne & (""[matchOne & 0xff] & 0x20 ^ 0xffffffff);
            matchOne = (u32)""[matchOne & 0xff];
          }
          while( true ) {
            puVar8 = &pInfo_local->matchOne;
            uVar3 = (uint)pInfo_local->matchAll;
            if (uVar3 == 0) break;
            pInfo_local = (compareInfo *)puVar8;
            if (((uVar3 == matchOne) || (uVar3 == bMatch_2)) &&
               (iVar5 = patternCompare(zString_local,puVar8,pInfo,matchOther), iVar5 != 1)) {
              return iVar5;
            }
          }
        }
        else {
          while( true ) {
            if (pInfo_local->matchAll < 0x80) {
              local_74 = (uint)pInfo_local->matchAll;
              pInfo_local = (compareInfo *)&pInfo_local->matchOne;
            }
            else {
              local_74 = sqlite3Utf8Read((uchar **)&pInfo_local);
            }
            if (local_74 == 0) break;
            if ((local_74 == matchOne) &&
               (iVar5 = patternCompare(zString_local,&pInfo_local->matchAll,pInfo,matchOther),
               iVar5 != 1)) {
              return iVar5;
            }
          }
        }
        return 2;
      }
      if (local_68 == matchOther) break;
LAB_003e240f:
      if (pInfo_local->matchAll < 0x80) {
        local_7c = (uint)pInfo_local->matchAll;
        pInfo_local = (compareInfo *)&pInfo_local->matchOne;
      }
      else {
        local_7c = sqlite3Utf8Read((uchar **)&pInfo_local);
      }
      if (((matchOne != local_7c) &&
          ((((uVar2 == '\0' || (""[matchOne & 0xff] != ""[local_7c & 0xff])) || (0x7f < matchOne))
           || (0x7f < local_7c)))) &&
         (((matchOne != uVar3 || (zString_local == _cx)) || (local_7c == 0)))) {
        return 1;
      }
    }
    if (pInfo->matchSet == '\0') {
      matchOne = sqlite3Utf8Read(&zString_local);
      if (matchOne == 0) {
        return 1;
      }
      _cx = zString_local;
      goto LAB_003e240f;
    }
    invert = 0;
    bVar10 = false;
    uVar4 = sqlite3Utf8Read((uchar **)&pInfo_local);
    if (uVar4 == 0) {
      return 1;
    }
    matchAll = sqlite3Utf8Read(&zString_local);
    bVar9 = matchAll == 0x5e;
    if (bVar9) {
      matchAll = sqlite3Utf8Read(&zString_local);
    }
    if (matchAll == 0x5d) {
      bVar10 = uVar4 == 0x5d;
      matchAll = sqlite3Utf8Read(&zString_local);
    }
    while (matchAll != 0 && matchAll != 0x5d) {
      if (((matchAll == 0x2d) && (*zString_local != ']')) &&
         ((*zString_local != '\0' && (invert != 0)))) {
        uVar6 = sqlite3Utf8Read(&zString_local);
        if (((uint)invert <= uVar4) && (uVar4 <= uVar6)) {
          bVar10 = true;
        }
        invert = 0;
      }
      else {
        if (uVar4 == matchAll) {
          bVar10 = true;
        }
        invert = matchAll;
      }
      matchAll = sqlite3Utf8Read(&zString_local);
    }
    if ((matchAll == 0) || (bVar10 == bVar9)) {
      return 1;
    }
  } while( true );
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */
  
  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<=0x80 ){
        u32 cx;
        int bMatch;
        if( noCase ){
          cx = sqlite3Toupper(c);
          c = sqlite3Tolower(c);
        }else{
          cx = c;
        }
        while( (c2 = *(zString++))!=0 ){
          if( c2!=c && c2!=cx ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}